

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_reshape_2d(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1)

{
  _Bool _Var1;
  int iVar2;
  ggml_tensor *pgVar3;
  int in_ECX;
  int in_EDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int ne [2];
  _Bool is_node;
  void *in_stack_00000130;
  int *in_stack_00000138;
  int in_stack_00000140;
  ggml_type in_stack_00000144;
  ggml_context *in_stack_00000148;
  
  _Var1 = ggml_is_contiguous(in_RSI);
  if (!_Var1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xed5,
            "ggml_is_contiguous(a)");
    abort();
  }
  iVar2 = ggml_nelements(in_RSI);
  if (iVar2 == in_EDX * in_ECX) {
    if (in_RSI->grad == (ggml_tensor *)0x0) {
      pgVar3 = ggml_new_tensor_impl
                         (in_stack_00000148,in_stack_00000144,in_stack_00000140,in_stack_00000138,
                          in_stack_00000130);
      pgVar3->op = GGML_OP_RESHAPE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = in_RSI;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xedb,
            "false");
    abort();
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xed6,
          "ggml_nelements(a) == ne0*ne1");
  abort();
}

Assistant:

struct ggml_tensor * ggml_reshape_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_nelements(a) == ne0*ne1);

    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    const int ne[2] = { ne0, ne1 };
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 2, ne, a->data);

    result->op   = GGML_OP_RESHAPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}